

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStartStructMethod
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *code,IDLOptions *options)

{
  CodeWriter *sd;
  anon_class_16_2_8dc4c3a7 local_128;
  function<void_()> local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  IDLOptions *local_28;
  IDLOptions *options_local;
  CodeWriter *code_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  local_28 = options;
  options_local = (IDLOptions *)code;
  code_local = (CodeWriter *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"start",&local_69);
  sd = code_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  IdlNamer::LegacyJavaMethod2(&local_48,&this->namer_,&local_68,(StructDef *)sd,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"builder: FlatBufferBuilder",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  local_128.code = (CodeWriter *)options_local;
  local_128.struct_def = (StructDef *)code_local;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStartStructMethod(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_118,&local_128);
  GenerateFunOneLine(code,&local_48,&local_c8,&local_f0,&local_118,
                     (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void GenerateStartStructMethod(StructDef &struct_def, CodeWriter &code,
                                 const IDLOptions options) const {
    GenerateFunOneLine(
        code, namer_.LegacyJavaMethod2("start", struct_def, ""),
        "builder: FlatBufferBuilder", "",
        [&]() {
          code += "builder.startTable(" +
                  NumToString(struct_def.fields.vec.size()) + ")";
        },
        options.gen_jvmstatic);
  }